

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

void stb__arr_deleten_(void **pp,int size,int i,int n)

{
  void *pvVar1;
  undefined4 local_44;
  void *p;
  int n_local;
  int i_local;
  int size_local;
  void **pp_local;
  
  pvVar1 = *pp;
  if (n != 0) {
    if (pvVar1 == (void *)0x0) {
      local_44 = 0;
    }
    else {
      local_44 = *(int *)((long)pvVar1 + -0x10);
    }
    memmove((void *)((long)pvVar1 + (long)(i * size)),
            (void *)((long)pvVar1 + (long)((i + n) * size)),(long)(size * (local_44 - (i + n))));
    *(int *)((long)pvVar1 + -0x10) = *(int *)((long)pvVar1 + -0x10) - n;
  }
  *pp = pvVar1;
  return;
}

Assistant:

void stb__arr_deleten_(void **pp, int size, int i, int n  STB__PARAMS)
{
   void *p = *pp;
   if (n) {
      memmove((char *) p + i*size, (char *) p + (i+n)*size, size * (stb_arr_len2(p)-(i+n)));
      stb_arrhead2(p)->len -= n;
   }
   *pp = p;
}